

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void Js::ScriptContext::RecyclerFunctionCallbackForDebugger(void *address,size_t size)

{
  byte bVar1;
  ScriptContext *this;
  FunctionProxy *this_00;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  ScriptFunction *pSVar8;
  ScriptFunctionWithInlineCache *this_01;
  
  this = *(ScriptContext **)(*(long *)(*(long *)((long)address + 8) + 8) + 0x490);
  if (this == (ScriptContext *)0x0) {
    return;
  }
  iVar5 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this);
  if ((char)iVar5 != '\0') {
    return;
  }
  if (this->isEnumeratingRecyclerObjects != true) {
    return;
  }
  if (*(undefined1 **)((long)address + 0x28) ==
      JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x100e,
                                "(pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk)"
                                ,
                                "pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk"
                               );
    if (!bVar4) goto LAB_00799f8a;
    *puVar7 = 0;
  }
  this_00 = ((*(FunctionInfo **)((long)address + 0x28))->functionBodyImpl).ptr;
  if (this_00 == (FunctionProxy *)0x0) {
    BVar6 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)address);
    if (BVar6 != 0) {
      return;
    }
    if (DAT_015b5f8d != '\x01') {
      return;
    }
    bVar4 = IsScriptContextInDebugMode(this);
    if (!bVar4) {
      RestoreEntryPointFromProfileThunk((JavascriptFunction *)address);
      return;
    }
    SetEntryPointToProfileThunk((JavascriptFunction *)address);
    return;
  }
  if ((this_00->functionInfo).ptr != *(FunctionInfo **)((long)address + 0x28)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1031,"(proxy->GetFunctionInfo() == info)",
                                "proxy->GetFunctionInfo() == info");
    if (!bVar4) goto LAB_00799f8a;
    *puVar7 = 0;
  }
  bVar4 = FunctionProxy::IsFunctionBody(this_00);
  if (!bVar4) {
    return;
  }
  BVar6 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)address);
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1038,"(pFunction->IsScriptFunction())",
                                "pFunction->IsScriptFunction()");
    if (!bVar4) goto LAB_00799f8a;
    *puVar7 = 0;
  }
  if ((((this_00->m_utf8SourceInfo).ptr)->field_0xa8 & 4) == 0) {
    JavascriptFunction::ResetConstructorCacheToDefault((JavascriptFunction *)address);
  }
  bVar4 = VarIs<Js::ScriptFunction,Js::RecyclableObject>((RecyclableObject *)address);
  if ((bVar4) &&
     (pSVar8 = UnsafeVarTo<Js::ScriptFunction,Js::RecyclableObject>((RecyclableObject *)address),
     pSVar8->hasInlineCaches == true)) {
    this_01 = VarTo<Js::ScriptFunctionWithInlineCache,Js::JavascriptFunction>
                        ((JavascriptFunction *)address);
    ScriptFunctionWithInlineCache::ClearInlineCacheOnFunctionObject(this_01);
  }
  bVar4 = FunctionProxy::IsFunctionBody(this_00);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar4) {
LAB_00799f8a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  bVar4 = IsScriptContextInDebugMode(this);
  if (bVar4) {
    pUVar2 = (this_00->m_utf8SourceInfo).ptr;
    bVar1 = pUVar2->field_0xa8;
    if ((((bVar1 & 4) == 0) && ((this_00->field_0x46 & 8) == 0)) &&
       (((bVar1 & 0x40) == 0 ||
        ((bVar1 & 0x20) == 0 && (pUVar2->debugModeSource).ptr == (uchar *)0x0)))) {
      Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  pSVar8 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>((JavascriptFunction *)address);
  TransitionEnvironmentForDebugger(this,pSVar8);
  return;
}

Assistant:

void ScriptContext::RecyclerFunctionCallbackForDebugger(void *address, size_t size)
    {
        JavascriptFunction *pFunction = (JavascriptFunction *)address;

        ScriptContext* scriptContext = pFunction->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            // Can't enumerate from closed scriptcontext
            return;
        }

        if (!scriptContext->IsEnumeratingRecyclerObjects())
        {
            return; // function not from enumerating script context
        }

        // Wrapped function are not allocated with the EnumClass bit
        Assert(pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk);

        FunctionInfo * info = pFunction->GetFunctionInfo();
        FunctionProxy * proxy = info->GetFunctionProxy();

        if (proxy == nullptr)
        {
            // Not a user defined function, we need to wrap them with try-catch for "continue after exception"
            if (!pFunction->IsScriptFunction() && IsExceptionWrapperForBuiltInsEnabled(scriptContext))
            {
#if defined(ENABLE_SCRIPT_DEBUGGING) || defined(ENABLE_SCRIPT_PROFILING)
                if (scriptContext->IsScriptContextInDebugMode())
                {
                    // We are attaching.
                    // For built-ins, WinRT and DOM functions which are already in recycler, change entry points to route to debug/profile thunk.
                    ScriptContext::SetEntryPointToProfileThunk(pFunction);
                }
                else
                {
                    // We are detaching.
                    // For built-ins, WinRT and DOM functions which are already in recycler, restore entry points to original.
                    if (!scriptContext->IsProfiling())
                    {
                        ScriptContext::RestoreEntryPointFromProfileThunk(pFunction);
                    }
                    // If we are profiling, don't change anything.
                }
#else
                AssertMsg(false, "Debugging/Profiling needs to be enabled to change thunks");
#endif
            }

            return;
        }

        Assert(proxy->GetFunctionInfo() == info);

        if (!proxy->IsFunctionBody())
        {
            // REVIEW: why we still have function that is still deferred?
            return;
        }
        Assert(pFunction->IsScriptFunction());

        // Excluding the internal library code, which is not debuggable already
        if (!proxy->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            // Reset the constructor cache to default, so that it will not pick up the cached type, created before debugging.
            // Look bug: 301517
            pFunction->ResetConstructorCacheToDefault();
        }

        if (VarIs<ScriptFunctionWithInlineCache>(pFunction))
        {
            VarTo<ScriptFunctionWithInlineCache>(pFunction)->ClearInlineCacheOnFunctionObject();
        }

        // We should have force parsed the function, and have a function body
        FunctionBody * pBody = proxy->GetFunctionBody();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (scriptContext->IsScriptContextInDebugMode() &&
            !proxy->GetUtf8SourceInfo()->GetIsLibraryCode() &&
#ifdef ENABLE_WASM
            !pBody->IsWasmFunction() &&
#endif
            !pBody->IsInDebugMode())
        {
            // Identifying if any function escaped for not being in debug mode. (This can be removed as a part of TFS : 935011)
            Throw::FatalInternalError();
        }
#endif

#ifdef ASMJS_PLAT
        ScriptFunction * scriptFunction = VarTo<ScriptFunction>(pFunction);
        scriptContext->TransitionEnvironmentForDebugger(scriptFunction);
#endif
    }